

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

void __thiscall Patch::Node::Node(Node *this,Deserializer *input)

{
  uint uVar1;
  tuple<Text_*,_std::default_delete<Text>_> in_RAX;
  Text *pTVar2;
  pointer __p_1;
  pointer __p;
  __uniq_ptr_impl<Text,_std::default_delete<Text>_> local_38;
  
  this->left = (Node *)0x0;
  this->right = (Node *)0x0;
  local_38._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
  super__Head_base<0UL,_Text_*,_false>._M_head_impl =
       (tuple<Text_*,_std::default_delete<Text>_>)
       (tuple<Text_*,_std::default_delete<Text>_>)
       in_RAX.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
       super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  Point::Point(&this->old_extent,input);
  Point::Point(&this->new_extent,input);
  Point::Point(&this->old_distance_from_left_ancestor,input);
  Point::Point(&this->new_distance_from_left_ancestor,input);
  (this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
  super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
  _M_head_impl = (Text *)0x0;
  (this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
  super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.super__Head_base<0UL,_Text_*,_false>.
  _M_head_impl = (Text *)0x0;
  uVar1 = Deserializer::read<unsigned_int>(input);
  if (uVar1 == 0) {
    std::__uniq_ptr_impl<Text,_std::default_delete<Text>_>::reset
              ((__uniq_ptr_impl<Text,_std::default_delete<Text>_> *)&this->old_text,(pointer)0x0);
    uVar1 = Deserializer::read<unsigned_int>(input);
  }
  else {
    pTVar2 = (Text *)operator_new(0x38);
    Text::Text(pTVar2,input);
    local_38._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
    super__Head_base<0UL,_Text_*,_false>._M_head_impl =
         (tuple<Text_*,_std::default_delete<Text>_>)
         (_Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>)0x0;
    std::__uniq_ptr_impl<Text,_std::default_delete<Text>_>::reset
              ((__uniq_ptr_impl<Text,_std::default_delete<Text>_> *)&this->old_text,pTVar2);
    std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr
              ((unique_ptr<Text,_std::default_delete<Text>_> *)&local_38);
    uVar1 = 0;
  }
  this->old_text_size_ = uVar1;
  uVar1 = Deserializer::read<unsigned_int>(input);
  if (uVar1 == 0) {
    std::__uniq_ptr_impl<Text,_std::default_delete<Text>_>::reset
              ((__uniq_ptr_impl<Text,_std::default_delete<Text>_> *)&this->new_text,(pointer)0x0);
  }
  else {
    pTVar2 = (Text *)operator_new(0x38);
    Text::Text(pTVar2,input);
    local_38._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
    super__Head_base<0UL,_Text_*,_false>._M_head_impl =
         (tuple<Text_*,_std::default_delete<Text>_>)
         (_Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>)0x0;
    std::__uniq_ptr_impl<Text,_std::default_delete<Text>_>::reset
              ((__uniq_ptr_impl<Text,_std::default_delete<Text>_> *)&this->new_text,pTVar2);
    std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr
              ((unique_ptr<Text,_std::default_delete<Text>_> *)&local_38);
  }
  return;
}

Assistant:

Node(Deserializer &input) :
    left{nullptr},
    right{nullptr},
    old_extent{input},
    new_extent{input},
    old_distance_from_left_ancestor{input},
    new_distance_from_left_ancestor{input} {

    if (input.read<uint32_t>()) {
      old_text = unique_ptr<Text>{new Text{input}};
      old_text_size_ = 0;
    } else {
      old_text = nullptr;
      old_text_size_ = input.read<uint32_t>();
    }

    if (input.read<uint32_t>()) {
      new_text = unique_ptr<Text>{new Text{input}};
    } else {
      new_text = nullptr;
    }
  }